

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextures
          (ConversionStream *this,iterator *ScopeStart,iterator *ScopeEnd)

{
  HLSL2GLSLConverterImpl *pHVar1;
  bool bVar2;
  pointer pHVar3;
  Char *_Str;
  iterator local_70;
  iterator TmpToken_1;
  iterator TmpToken;
  HashMapStringKey local_48;
  _Node_iterator_base<Diligent::HashMapStringKey,_false> local_38;
  const_iterator ImgTypeIt;
  HLSLObjectInfo *pObjectInfo;
  iterator Token;
  iterator *ScopeEnd_local;
  iterator *ScopeStart_local;
  ConversionStream *this_local;
  
  pObjectInfo = (HLSLObjectInfo *)ScopeStart->_M_node;
  Token._M_node = (_List_node_base *)ScopeEnd;
  while (bVar2 = std::operator!=((_Self *)&pObjectInfo,(_Self *)Token._M_node), bVar2) {
    pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                       ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&pObjectInfo);
    if (pHVar3->Type == Identifier) {
      pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                         ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&pObjectInfo);
      ImgTypeIt.super__Node_iterator_base<Diligent::HashMapStringKey,_false>._M_cur =
           (_Node_iterator_base<Diligent::HashMapStringKey,_false>)
           FindHLSLObject(this,&pHVar3->Literal);
      if (ImgTypeIt.super__Node_iterator_base<Diligent::HashMapStringKey,_false>._M_cur ==
          (__node_type *)0x0) {
        std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
                  ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&pObjectInfo);
      }
      else {
        pHVar1 = this->m_Converter;
        _Str = (Char *)std::__cxx11::string::c_str();
        HashMapStringKey::HashMapStringKey(&local_48,_Str,false);
        local_38._M_cur =
             (__node_type *)
             std::
             unordered_set<Diligent::HashMapStringKey,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<Diligent::HashMapStringKey>_>
             ::find(&pHVar1->m_ImageTypes,&local_48);
        HashMapStringKey::~HashMapStringKey(&local_48);
        TmpToken._M_node =
             (_List_node_base *)
             std::
             unordered_set<Diligent::HashMapStringKey,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<Diligent::HashMapStringKey>_>
             ::end(&this->m_Converter->m_ImageTypes);
        bVar2 = std::__detail::operator==
                          (&local_38,
                           (_Node_iterator_base<Diligent::HashMapStringKey,_false> *)&TmpToken);
        if (bVar2) {
          std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
                    ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&pObjectInfo);
        }
        else {
          TmpToken_1._M_node = (_List_node_base *)pObjectInfo;
          bVar2 = ProcessRWTextureStore
                            (this,&TmpToken_1,(iterator *)Token._M_node,
                             *(Uint32 *)
                              ((long)ImgTypeIt.
                                     super__Node_iterator_base<Diligent::HashMapStringKey,_false>.
                                     _M_cur + 0x24));
          if (bVar2) {
            pObjectInfo = (HLSLObjectInfo *)TmpToken_1._M_node;
          }
          else {
            local_70._M_node = (_List_node_base *)pObjectInfo;
            bVar2 = ProcessRWTextureLoad
                              (this,&local_70,(iterator *)Token._M_node,
                               *(Uint32 *)
                                ((long)ImgTypeIt.
                                       super__Node_iterator_base<Diligent::HashMapStringKey,_false>.
                                       _M_cur + 0x24));
            if (bVar2) {
              pObjectInfo = (HLSLObjectInfo *)local_70._M_node;
            }
            else {
              std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
                        ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&pObjectInfo);
            }
          }
        }
      }
    }
    else {
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
                ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&pObjectInfo);
    }
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextures(const TokenListType::iterator& ScopeStart,
                                                                 const TokenListType::iterator& ScopeEnd)
{
    auto Token = ScopeStart;
    while (Token != ScopeEnd)
    {
        if (Token->Type == TokenType::Identifier)
        {
            // Try to find the object in all scopes
            const auto* pObjectInfo = FindHLSLObject(Token->Literal);
            if (pObjectInfo == nullptr)
            {
                ++Token;
                continue;
            }

            // Check if the object is image type
            auto ImgTypeIt = m_Converter.m_ImageTypes.find(pObjectInfo->GLSLType.c_str());
            if (ImgTypeIt == m_Converter.m_ImageTypes.end())
            {
                ++Token;
                continue;
            }

            {
                // Handle store first. If this is not a store operation,
                // ProcessRWTextureStore() returns false.
                auto TmpToken = Token;
                if (ProcessRWTextureStore(TmpToken, ScopeEnd, pObjectInfo->ArrayDim))
                {
                    Token = TmpToken;
                    continue;
                }
            }

            {
                // Handle load.
                auto TmpToken = Token;
                if (ProcessRWTextureLoad(TmpToken, ScopeEnd, pObjectInfo->ArrayDim))
                {
                    Token = TmpToken;
                    continue;
                }
            }

            ++Token;
        }
        else
            ++Token;
    }
}